

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operators.hpp
# Opt level: O2

void chaiscript::bootstrap::operators::not_equal<bool>(Module *m)

{
  allocator<char> local_3a [2];
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_28;
  
  make_shared<chaiscript::dispatch::Proxy_Function_Base,chaiscript::dispatch::Proxy_Function_Callable_Impl<bool(bool_const&,bool_const&),chaiscript::bootstrap::operators::not_equal<bool>(chaiscript::Module&)::_lambda(bool_const&,bool_const&)_1_>,chaiscript::bootstrap::operators::not_equal<bool>(chaiscript::Module&)::_lambda(bool_const&,bool_const&)_1_>
            ((anon_class_1_0_00000001_for_m_f *)&local_38);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"!=",local_3a);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)&m->m_funcs,&local_38,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_38.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  return;
}

Assistant:

void not_equal(Module &m) {
    m.add(chaiscript::fun([](const T &lhs, const T &rhs) { return lhs != rhs; }), "!=");
  }